

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic-sensor.cpp
# Opt level: O1

Vector __thiscall
stateObservation::AlgebraicSensor::getMeasurements(AlgebraicSensor *this,bool noisy)

{
  _func_int **__ptr;
  NoiseBase *pNVar1;
  long lVar2;
  int in_EDX;
  Index extraout_RDX;
  undefined7 in_register_00000031;
  long *plVar3;
  long *plVar4;
  Vector VVar5;
  undefined1 local_58 [32];
  _func_int **local_38;
  
  plVar3 = (long *)CONCAT71(in_register_00000031,noisy);
  if ((in_EDX == 0) || (plVar3[1] == 0)) {
    lVar2 = 0x58;
    if ((char)plVar3[10] != '\0') goto LAB_0013d646;
    plVar4 = plVar3 + 10;
    if (*(int *)((long)plVar3 + 0x14) == 0) {
      (**(code **)(*plVar3 + 0x68))(local_58,plVar3);
      local_38 = (_func_int **)plVar3[0xb];
      plVar3[0xb] = local_58._0_8_;
      pNVar1 = (NoiseBase *)plVar3[0xc];
      plVar3[0xc] = local_58._8_8_;
      local_58._0_8_ = local_38;
      local_58._8_8_ = pNVar1;
    }
    else {
      (**(code **)(*plVar3 + 0x68))
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_38,plVar3);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
      CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_58,
                 (Matrix<double,__1,_1,_0,__1,_1> *)(plVar3 + 0xb),
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_38);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_58,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(plVar3 + 5));
      if (((_func_int *)(local_58._24_8_ + local_58._8_8_) != *(_func_int **)(local_58._0_8_ + 8))
         || (local_58._16_8_ != 1)) {
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
    }
    free(local_38);
    lVar2 = 0x58;
  }
  else {
    lVar2 = 0x40;
    if ((char)plVar3[7] != '\0') goto LAB_0013d646;
    plVar4 = plVar3 + 7;
    computeNoisyMeasurement_((AlgebraicSensor *)local_58);
    __ptr = (_func_int **)plVar3[8];
    plVar3[8] = local_58._0_8_;
    pNVar1 = (NoiseBase *)plVar3[9];
    plVar3[9] = local_58._8_8_;
    local_58._0_8_ = __ptr;
    local_58._8_8_ = pNVar1;
    free(__ptr);
    lVar2 = 0x40;
  }
  *(undefined1 *)plVar4 = 1;
LAB_0013d646:
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,
             (DenseStorage<double,__1,__1,_1,_0> *)((long)plVar3 + lVar2));
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector AlgebraicSensor::getMeasurements(bool noisy)
    {
        if (noisy && noise_!=0x0)
        {
            if (!storedNoisyMeasurement_)
            {
                noisyMeasurement_ =  computeNoisyMeasurement_();
                storedNoisyMeasurement_=true;
            }
            return noisyMeasurement_;
        }
        else
        {
            if (!storedNoiselessMeasurement_)
            {
                if (concat_>0)
                  noiselessMeasurement_<< computeNoiselessMeasurement_() ,directInputToOutput_;
                else
                  noiselessMeasurement_= computeNoiselessMeasurement_();

                storedNoiselessMeasurement_=true;
            }
            return noiselessMeasurement_;
        }
    }